

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O3

bilingual_str * __thiscall bilingual_str::operator+=(bilingual_str *this,bilingual_str *rhs)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&this->original,(rhs->original)._M_dataplus._M_p,(rhs->original)._M_string_length);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&this->translated,(rhs->translated)._M_dataplus._M_p,
               (rhs->translated)._M_string_length);
    return this;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str& operator+=(const bilingual_str& rhs)
    {
        original += rhs.original;
        translated += rhs.translated;
        return *this;
    }